

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImplPrivate::sentUploadDataSlot
          (QNetworkReplyHttpImplPrivate *this,qint64 pos,qint64 amount)

{
  element_type *peVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (this->uploadByteDevice).
           super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    if (this->uploadByteDevicePosition + amount == pos) {
      (**(code **)(*(long *)peVar1 + 0x68))(peVar1,amount);
      this->uploadByteDevicePosition = this->uploadByteDevicePosition + amount;
    }
    else {
      local_38.d = (Data *)0x0;
      local_38.ptr = (char16_t *)0x0;
      local_38.size = 0;
      error(this,UnknownNetworkError,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::sentUploadDataSlot(qint64 pos, qint64 amount)
{
    if (!uploadByteDevice) // uploadByteDevice is no longer available
        return;

    if (uploadByteDevicePosition + amount != pos) {
        // Sanity check, should not happen.
        error(QNetworkReply::UnknownNetworkError, QString());
        return;
    }
    uploadByteDevice->advanceReadPointer(amount);
    uploadByteDevicePosition += amount;
}